

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O3

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertStandardItems
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int i;
  int iVar2;
  
  ConvertVars(this);
  ConvertSOSConstraints(this);
  iVar1 = (*(this->
            super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            ).
            super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            .
            super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
            ._vptr_BasicExprVisitor[0x12])(this);
  iVar1 = (int)((ulong)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x2b8) -
                       *(long *)(CONCAT44(extraout_var,iVar1) + 0x2b0)) >> 3) * -0x11111111;
  if (0 < iVar1) {
    iVar2 = 0;
    do {
      ExportCommonExpr(this,iVar2);
      (*(this->
        super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
        ).
        super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
        .
        super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
        ._vptr_BasicExprVisitor[0x12])(this);
      iVar2 = iVar2 + 1;
    } while (iVar1 != iVar2);
  }
  this->ifFltCon_ = 0;
  iVar1 = (*(this->
            super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            ).
            super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            .
            super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
            ._vptr_BasicExprVisitor[0x12])(this);
  iVar1 = (int)((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar1) + 0x200) -
                       *(long *)(CONCAT44(extraout_var_00,iVar1) + 0x1f8)) >> 3) * -0x11111111;
  if (0 < iVar1) {
    iVar2 = 0;
    do {
      ExportObj(this,iVar2);
      ConvertObj(this,iVar2);
      iVar2 = iVar2 + 1;
    } while (iVar1 != iVar2);
  }
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateObjContexts
            (&(this->flat_cvt_).
              super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            );
  this->ifFltCon_ = 1;
  iVar1 = (*(this->
            super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            ).
            super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            .
            super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
            ._vptr_BasicExprVisitor[0x12])(this);
  iVar1 = (int)((ulong)(*(long *)(CONCAT44(extraout_var_01,iVar1) + 0x230) -
                       *(long *)(CONCAT44(extraout_var_01,iVar1) + 0x228)) >> 3) * -0xf0f0f0f;
  if (0 < iVar1) {
    iVar2 = 0;
    do {
      ExportAlgCon(this,iVar2);
      ConvertAlgCon(this,iVar2);
      iVar2 = iVar2 + 1;
    } while (iVar1 != iVar2);
  }
  this->ifFltCon_ = 1;
  iVar1 = (*(this->
            super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            ).
            super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            .
            super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
            ._vptr_BasicExprVisitor[0x12])(this);
  iVar1 = (int)((ulong)(*(long *)(CONCAT44(extraout_var_02,iVar1) + 0x2a0) -
                       *(long *)(CONCAT44(extraout_var_02,iVar1) + 0x298)) >> 3);
  if (0 < iVar1) {
    iVar2 = 0;
    do {
      ExportLogCon(this,iVar2);
      ConvertLogicalCon(this,iVar2);
      iVar2 = iVar2 + 1;
    } while (iVar1 != iVar2);
  }
  CopyItemNames(this);
  Shrink(this->p_qp2p_visitor_);
  this->ifFltCon_ = -1;
  return;
}

Assistant:

void ConvertStandardItems() {
    ////////////////////////// Variables
    ConvertVars();

    ////////////////////// SOS constraints //////////////////////////
    /// SOS2 come before algebraic constraints, so we can omit
    /// AMPL's linearization of SOS2 (in case we use them).
    MP_DISPATCH( ConvertSOSConstraints() );

    ////////////////////////// Common exprs
    int num_common_exprs = GetModel().num_common_exprs();
    for (int i = 0; i < num_common_exprs; ++i) {
      MPD( ExportCommonExpr(i) );
      MP_DISPATCH( Convert( GetModel().common_expr(i) ) );
    }

    ////////////////////////// Objectives
    ifFltCon_ = 0;
    if (int num_objs = GetModel().num_objs())
      for (int i = 0; i < num_objs; ++i) {
        MPD( ExportObj(i) );
        MP_DISPATCH( ConvertObj( i ) );
      }
    GetFlatCvt().PropagateObjContexts();      // all now, because of GetMOWeights()

    ////////////////////////// Algebraic constraints
    ifFltCon_ = 1;
    if (int n_cons = GetModel().num_algebraic_cons())
      for (int i = 0; i < n_cons; ++i) {
        MPD( ExportAlgCon(i) );
        MP_DISPATCH( ConvertAlgCon( i ) );
      }

    ////////////////////////// Logical constraints
    ifFltCon_ = 1;
    if (int n_lcons = GetModel().num_logical_cons())
      for (int i = 0; i < n_lcons; ++i) {
        MPD( ExportLogCon(i) );
        MP_DISPATCH( ConvertLogicalCon( i ) );
      }

    // We could have produced variable names
    // when exporting NL model info
    CopyItemNames();

    // Shrink temp storage
    Shrink();

    // Signal we are not flattening anything
    ifFltCon_ = -1;
  }